

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O3

long __thiscall
duckdb::DateDiffTernaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t,long>
          (DateDiffTernaryOperator *this,string_t part,date_t startdate,date_t enddate,
          ValidityMask *mask,idx_t idx)

{
  byte bVar1;
  _Head_base<0UL,_unsigned_long_*,_false> *p_Var2;
  uint uVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  DatePartSpecifier DVar7;
  int32_t iVar8;
  int32_t iVar9;
  int iVar10;
  long lVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  _Head_base<0UL,_unsigned_long_*,_false> _Var13;
  int64_t iVar14;
  ulong uVar15;
  NotImplementedException *this_00;
  int iVar16;
  date_t input;
  uint uVar17;
  ulong uVar18;
  undefined4 in_register_00000084;
  int64_t iVar19;
  long lVar20;
  int32_t end_month;
  int32_t end_year;
  int32_t start_month;
  int32_t end_day;
  int32_t start_day;
  int32_t start_year;
  date_t in_stack_ffffffffffffff5c;
  int local_9c;
  int local_98;
  int local_94;
  int32_t local_90;
  int32_t local_8c;
  string local_88;
  undefined8 local_60;
  long local_58;
  string local_50;
  
  p_Var2 = (_Head_base<0UL,_unsigned_long_*,_false> *)CONCAT44(in_register_00000084,enddate.days);
  input.days = part.value._8_4_;
  local_60 = this;
  local_58 = part.value._0_8_;
  bVar6 = Value::IsFinite<duckdb::date_t>(input);
  if ((!bVar6) || (bVar6 = Value::IsFinite<duckdb::date_t>(startdate), !bVar6)) {
    _Var13._M_head_impl = p_Var2->_M_head_impl;
    if (_Var13._M_head_impl == (unsigned_long *)0x0) {
      local_50._M_dataplus._M_p = (pointer)p_Var2[3]._M_head_impl;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_88,(unsigned_long *)&local_50);
      sVar5 = local_88._M_string_length;
      _Var4._M_p = local_88._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      _Var13._M_head_impl = p_Var2[2]._M_head_impl;
      p_Var2[1]._M_head_impl = (unsigned_long *)_Var4._M_p;
      p_Var2[2]._M_head_impl = (unsigned_long *)sVar5;
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var13._M_head_impl !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var13._M_head_impl),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
      }
      pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                           (p_Var2 + 1));
      _Var13._M_head_impl =
           (pTVar12->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      p_Var2->_M_head_impl = _Var13._M_head_impl;
    }
    bVar1 = (byte)mask & 0x3f;
    _Var13._M_head_impl[(ulong)mask >> 6] =
         _Var13._M_head_impl[(ulong)mask >> 6] &
         (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    return 0;
  }
  lVar11 = part.value._0_8_;
  if ((uint)this < 0xd) {
    lVar11 = (long)&local_60 + 4;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,lVar11,((ulong)this & 0xffffffff) + lVar11);
  DVar7 = GetDatePartSpecifier(&local_50);
  switch(DVar7) {
  case BEGIN_BIGINT:
    iVar8 = Date::ExtractYear(in_stack_ffffffffffffff5c);
    iVar16 = Date::ExtractYear(in_stack_ffffffffffffff5c);
    goto LAB_019cd3ae;
  case MONTH:
    Date::Convert(input,(int32_t *)&local_88,&local_94,&local_8c);
    Date::Convert(startdate,&local_98,&local_9c,&local_90);
    lVar11 = (long)((local_9c - local_94) + (local_98 - (int)local_88._M_dataplus._M_p) * 0xc);
    goto LAB_019cd3b3;
  case DAY:
  case DOW:
  case ISODOW:
  case DOY:
  case JULIAN_DAY:
    iVar8 = Date::EpochDays(startdate);
    iVar9 = Date::EpochDays(input);
    iVar19 = (int64_t)iVar8;
    lVar11 = (long)iVar9;
    break;
  case DECADE:
    iVar8 = Date::ExtractYear(in_stack_ffffffffffffff5c);
    iVar9 = Date::ExtractYear(in_stack_ffffffffffffff5c);
    iVar16 = iVar8 / 10;
    uVar3 = (uint)((ulong)((long)iVar9 * -0x66666667) >> 0x20);
    uVar17 = uVar3 >> 0x1f;
    iVar10 = (int)uVar3 >> 2;
    goto LAB_019cd395;
  case CENTURY:
    iVar8 = Date::ExtractYear(in_stack_ffffffffffffff5c);
    iVar9 = Date::ExtractYear(in_stack_ffffffffffffff5c);
    iVar16 = iVar8 / 100;
    uVar3 = (uint)((ulong)((long)iVar9 * -0x51eb851f) >> 0x20);
    uVar17 = uVar3 >> 0x1f;
    iVar10 = (int)uVar3 >> 5;
    goto LAB_019cd395;
  case MILLENNIUM:
    iVar8 = Date::ExtractYear(in_stack_ffffffffffffff5c);
    iVar9 = Date::ExtractYear(in_stack_ffffffffffffff5c);
    iVar16 = iVar8 / 1000;
    uVar3 = (uint)((ulong)((long)iVar9 * -0x10624dd3) >> 0x20);
    uVar17 = uVar3 >> 0x1f;
    iVar10 = (int)uVar3 >> 6;
LAB_019cd395:
    iVar16 = iVar10 + uVar17 + iVar16;
LAB_019cd399:
    lVar11 = (long)iVar16;
    goto LAB_019cd3b3;
  case MICROSECONDS:
    iVar19 = Date::EpochMicroseconds(startdate);
    lVar11 = Date::EpochMicroseconds(input);
    break;
  case MILLISECONDS:
    iVar19 = Date::EpochMicroseconds(startdate);
    iVar14 = Date::EpochMicroseconds(input);
    lVar11 = iVar19 / 1000;
    uVar18 = SUB168(SEXT816(iVar14) * SEXT816(-0x20c49ba5e353f7cf),8);
    uVar15 = uVar18 >> 0x3f;
    lVar20 = (long)uVar18 >> 7;
    goto LAB_019cd2f6;
  case SECOND:
  case BEGIN_DOUBLE:
    iVar19 = Date::Epoch(startdate);
    lVar11 = Date::Epoch(input);
    break;
  case MINUTE:
    iVar19 = Date::Epoch(startdate);
    iVar14 = Date::Epoch(input);
    lVar11 = iVar19 / 0x3c;
    uVar18 = SUB168(SEXT816(iVar14) * SEXT816(0x7777777777777777),8) - iVar14;
    uVar15 = uVar18 >> 0x3f;
    lVar20 = (long)uVar18 >> 5;
    goto LAB_019cd2f6;
  case HOUR:
    iVar19 = Date::Epoch(startdate);
    iVar14 = Date::Epoch(input);
    lVar11 = iVar19 / 0xe10;
    uVar18 = SUB168(SEXT816(iVar14) * SEXT816(-0x48d159e26af37c05),8);
    uVar15 = uVar18 >> 0x3f;
    lVar20 = (long)uVar18 >> 10;
LAB_019cd2f6:
    lVar11 = lVar20 + uVar15 + lVar11;
    goto LAB_019cd3b3;
  case WEEK:
  case YEARWEEK:
    iVar16 = (startdate.days - input.days) / 7;
    goto LAB_019cd399;
  case ISOYEAR:
    iVar8 = Date::ExtractISOYearNumber(startdate);
    iVar16 = Date::ExtractISOYearNumber(input);
LAB_019cd3ae:
    lVar11 = (long)(iVar8 - iVar16);
    goto LAB_019cd3b3;
  case QUARTER:
    Date::Convert(input,(int32_t *)&local_88,&local_94,&local_8c);
    Date::Convert(startdate,&local_98,&local_9c,&local_90);
    iVar16 = local_94 + (int)local_88._M_dataplus._M_p * 0xc + -1;
    iVar16 = (int)((ulong)((long)iVar16 * 0x55555555) >> 0x20) - iVar16;
    lVar11 = (long)(((iVar16 >> 1) - (iVar16 >> 0x1f)) + (local_9c + local_98 * 0xc + -1) / 3);
    goto LAB_019cd3b3;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Specifier type not implemented for DATEDIFF","");
    NotImplementedException::NotImplementedException(this_00,&local_88);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lVar11 = iVar19 - lVar11;
LAB_019cd3b3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return lVar11;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return DifferenceDates<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}